

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::parse_prelude_literal(Parser *this)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  pointer pTVar4;
  byte local_ac;
  string local_98;
  Token<ParsedGame::PreludeTokenType> local_78;
  byte local_45;
  bool detected_literal_end;
  allocator<char> local_31;
  string local_30 [8];
  string current_literal_string;
  Parser *this_local;
  
  current_literal_string.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                     (&this->m_text_provider);
  cVar1 = TextProvider::get_current_char(pTVar4);
  if (cVar1 != ' ') {
    pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    TextProvider::get_current_char(pTVar4);
    std::__cxx11::string::push_back((char)local_30);
  }
  local_45 = 0;
  while( true ) {
    pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    uVar3 = (*pTVar4->_vptr_TextProvider[2])();
    local_ac = 0;
    if ((uVar3 & 1) != 0) {
      local_ac = local_45 ^ 0xff;
    }
    if ((local_ac & 1) == 0) break;
    pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    (*pTVar4->_vptr_TextProvider[3])();
    bVar2 = try_parse_return(this,false);
    if (bVar2) {
      local_45 = 1;
      pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      (*pTVar4->_vptr_TextProvider[4])();
    }
    else {
      pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      cVar1 = TextProvider::get_current_char(pTVar4);
      if (cVar1 == '(') {
        parse_comment(this,0);
      }
      else {
        pTVar4 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        TextProvider::get_current_char(pTVar4);
        std::__cxx11::string::push_back((char)local_30);
      }
    }
  }
  std::__cxx11::string::string((string *)&local_98,local_30);
  Token<ParsedGame::PreludeTokenType>::Token(&local_78,Literal,&local_98,this->m_line_counter);
  std::
  vector<Token<ParsedGame::PreludeTokenType>,_std::allocator<Token<ParsedGame::PreludeTokenType>_>_>
  ::push_back(&(this->m_parsed_game).prelude_tokens,&local_78);
  Token<ParsedGame::PreludeTokenType>::~Token(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Parser::parse_prelude_literal()
{
	string current_literal_string = "";
	if(m_text_provider->get_current_char() != ' ')
	{
		current_literal_string.push_back(m_text_provider->get_current_char());
	}

	bool detected_literal_end = false;
	while(m_text_provider->is_valid() && !detected_literal_end)
	{
		m_text_provider->advance();
		if(try_parse_return(false))
		{
			detected_literal_end = true;
			m_text_provider->reverse();
		}
		else
		{
			switch(m_text_provider->get_current_char())
			{
				case '(':
					parse_comment();
					break;
				default:
					current_literal_string.push_back(m_text_provider->get_current_char());
				break;
			}
		}
	}

	m_parsed_game.prelude_tokens.push_back(Token<ParsedGame::PreludeTokenType>(ParsedGame::PreludeTokenType::Literal,current_literal_string, m_line_counter));
}